

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void __thiscall DFrameBuffer::DrawRateStuff(DFrameBuffer *this)

{
  BYTE *pBVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char fpsbuff [40];
  
  if (vid_fps.Value) {
    uVar2 = I_FPSTime();
    uVar10 = uVar2 - this->LastMS;
    if (-1 < (int)uVar10) {
      iVar3 = active_con_scale();
      if (iVar3 == 0) {
        iVar3 = CleanXfac;
      }
      mysnprintf(fpsbuff,0x28,"%2u ms (%3u fps)",(ulong)uVar10,(ulong)this->LastCount);
      iVar8 = (this->super_DSimpleCanvas).super_DCanvas.Width;
      iVar4 = FFont::StringWidth(ConFont,(BYTE *)fpsbuff);
      iVar4 = iVar8 / iVar3 - iVar4;
      (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (this,(ulong)(uint)(iVar4 * iVar3),0,
                 (ulong)(uint)(this->super_DSimpleCanvas).super_DCanvas.Width,
                 (ulong)(uint)(ConFont->FontHeight * iVar3),(ulong)GPalette.BlackIndex,0);
      if (iVar3 == 1) {
        iVar3 = 0;
      }
      else {
        iVar3 = 0x40001399;
      }
      DCanvas::DrawText((DCanvas *)this,ConFont,9,iVar4,0,fpsbuff,iVar3);
      uVar10 = uVar2 / 1000;
      uVar9 = uVar10 - this->LastSec;
      if (uVar10 < this->LastSec || uVar9 == 0) {
        uVar5 = this->FrameCount + 1;
      }
      else {
        this->LastCount = this->FrameCount / uVar9;
        this->LastSec = uVar10;
        this->FrameCount = 0;
        uVar5 = 1;
      }
      this->FrameCount = uVar5;
    }
    this->LastMS = uVar2;
  }
  if (ticker.Value == true) {
    uVar2 = 0;
    uVar5 = (*I_GetTime)(false);
    iVar8 = uVar5 - this->LastTic;
    pBVar1 = (this->super_DSimpleCanvas).super_DCanvas.Buffer;
    this->LastTic = uVar5;
    iVar3 = 0x14;
    if (iVar8 < 0x14) {
      iVar3 = iVar8;
    }
    if (pBVar1 == (BYTE *)0x0) {
      for (; SBORROW4(uVar2,iVar3 * 2) != (int)(uVar2 + iVar3 * -2) < 0; uVar2 = uVar2 + 2) {
        uVar10 = (this->super_DSimpleCanvas).super_DCanvas.Height;
        (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (this,(ulong)uVar2,(ulong)(uVar10 - 1),(ulong)(uVar2 + 1),(ulong)uVar10,0xff,0);
      }
      for (; uVar2 < 0x28; uVar2 = uVar2 + 2) {
        uVar10 = (this->super_DSimpleCanvas).super_DCanvas.Height;
        (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (this,(ulong)uVar2,(ulong)(uVar10 - 1),(ulong)(uVar2 + 1),(ulong)uVar10,0,0);
      }
    }
    else {
      iVar8 = ((this->super_DSimpleCanvas).super_DCanvas.Height + -1) *
              (this->super_DSimpleCanvas).super_DCanvas.Pitch;
      for (uVar6 = 0; (long)uVar6 < (long)(iVar3 * 2); uVar6 = uVar6 + 2) {
        pBVar1[uVar6 + (long)iVar8] = 0xff;
      }
      for (; uVar6 < 0x28; uVar6 = uVar6 + 2) {
        pBVar1[uVar6 + (long)iVar8] = '\0';
      }
    }
  }
  if (vid_showpalette.Value != 0) {
    if ((DrawRateStuff()::palette == '\0') &&
       (iVar3 = __cxa_guard_acquire(&DrawRateStuff()::palette), iVar3 != 0)) {
      FPaletteTester::FPaletteTester(&DrawRateStuff::palette);
      __cxa_atexit(FTexture::~FTexture,&DrawRateStuff::palette,&__dso_handle);
      __cxa_guard_release(&DrawRateStuff()::palette);
    }
    uVar7 = 0xe0;
    if ((screen->super_DSimpleCanvas).super_DCanvas.Height < 800) {
      uVar7 = 0x70;
    }
    if (vid_showpalette.Value - 1U < 9) {
      DrawRateStuff::palette.WantTranslation = vid_showpalette.Value;
    }
    DCanvas::DrawTexture
              ((DCanvas *)this,&DrawRateStuff::palette.super_FTexture,0.0,0.0,0x40001389,uVar7,
               0x4000138a,uVar7,0x400013a5,0,0);
  }
  return;
}

Assistant:

void DFrameBuffer::DrawRateStuff ()
{
	// Draws frame time and cumulative fps
	if (vid_fps)
	{
		DWORD ms = I_FPSTime();
		DWORD howlong = ms - LastMS;
		if ((signed)howlong >= 0)
		{
			char fpsbuff[40];
			int chars;
			int rate_x;

			int textScale = active_con_scale();
			if (textScale == 0)
				textScale = CleanXfac;

			chars = mysnprintf (fpsbuff, countof(fpsbuff), "%2u ms (%3u fps)", howlong, LastCount);
			rate_x = Width / textScale - ConFont->StringWidth(&fpsbuff[0]);
			Clear (rate_x * textScale, 0, Width, ConFont->GetHeight() * textScale, GPalette.BlackIndex, 0);
			if (textScale == 1)
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0], TAG_DONE);
			else
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0],
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			DWORD thisSec = ms/1000;
			if (LastSec < thisSec)
			{
				LastCount = FrameCount / (thisSec - LastSec);
				LastSec = thisSec;
				FrameCount = 0;
			}
			FrameCount++;
		}
		LastMS = ms;
	}

	// draws little dots on the bottom of the screen
	if (ticker)
	{
		int i = I_GetTime(false);
		int tics = i - LastTic;
		BYTE *buffer = GetBuffer();

		LastTic = i;
		if (tics > 20) tics = 20;

		// Buffer can be NULL if we're doing hardware accelerated 2D
		if (buffer != NULL)
		{
			buffer += (GetHeight()-1) * GetPitch();
			
			for (i = 0; i < tics*2; i += 2)		buffer[i] = 0xff;
			for ( ; i < 20*2; i += 2)			buffer[i] = 0x00;
		}
		else
		{
			for (i = 0; i < tics*2; i += 2)		Clear(i, Height-1, i+1, Height, 255, 0);
			for ( ; i < 20*2; i += 2)			Clear(i, Height-1, i+1, Height, 0, 0);
		}
	}

	// draws the palette for debugging
	if (vid_showpalette)
	{
		// This used to just write the palette to the display buffer.
		// With hardware-accelerated 2D, that doesn't work anymore.
		// Drawing it as a texture does and continues to show how
		// well the PalTex shader is working.
		static FPaletteTester palette;
		int size = screen->GetHeight() < 800 ? 16 * 7 : 16 * 7 * 2;

		palette.SetTranslation(vid_showpalette);
		DrawTexture(&palette, 0, 0,
			DTA_DestWidth, size,
			DTA_DestHeight, size,
			DTA_Masked, false,
			TAG_DONE);
	}
}